

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdialog.cpp
# Opt level: O1

void QDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined4 uVar2;
  void **ppvVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  undefined4 local_3c;
  void *local_38;
  undefined4 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_3c = *_a[1];
    puStack_30 = &local_3c;
    ppvVar3 = &local_38;
    local_38 = (void *)0x0;
    iVar4 = 0;
    goto LAB_004e26da;
  case 1:
    iVar4 = 1;
    goto LAB_004e26d8;
  case 2:
    iVar4 = 2;
LAB_004e26d8:
    ppvVar3 = (void **)0x0;
LAB_004e26da:
    QMetaObject::activate(_o,&staticMetaObject,iVar4,ppvVar3);
    break;
  case 3:
    (**(code **)(*(long *)_o + 0x1a0))(_o);
    break;
  case 4:
    uVar2 = (**(code **)(*(long *)_o + 0x1a8))(_o);
    if ((undefined4 *)*_a != (undefined4 *)0x0) {
      *(undefined4 *)*_a = uVar2;
    }
    break;
  case 5:
    (**(code **)(*(long *)_o + 0x1b0))(_o,*_a[1]);
    break;
  case 6:
    (**(code **)(*(long *)_o + 0x1b8))(_o);
    break;
  case 7:
    (**(code **)(*(long *)_o + 0x1c0))(_o);
  }
  if (_c == ReadProperty) {
switchD_004e2630_caseD_1:
    if (_id == 1) {
      bVar5 = (*(byte *)(*(long *)(_o + 0x20) + 0x12) & 3) == 0;
LAB_004e27b1:
      *(bool *)*_a = !bVar5;
    }
    else if (_id == 0) {
      bVar5 = *(long *)(*(long *)(_o + 8) + 0x298) == 0;
      goto LAB_004e27b1;
    }
    if (_c != WriteProperty) goto switchD_004e2630_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_004e2630_caseD_3;
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == finished) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_004e2630_caseD_3;
    }
    if (((code *)*plVar1 == accepted) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_004e2630_caseD_3;
    }
    if (((code *)*plVar1 == rejected) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_004e2630_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_004e2630_caseD_3;
      goto switchD_004e2630_caseD_1;
    }
  }
  if (_id == 1) {
    QWidget::setAttribute((QWidget *)_o,WA_ShowModal,**_a);
  }
  else if (_id == 0) {
    setSizeGripEnabled((QDialog *)_o,**_a);
  }
switchD_004e2630_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->accepted(); break;
        case 2: _t->rejected(); break;
        case 3: _t->open(); break;
        case 4: { int _r = _t->exec();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 5: _t->done((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->accept(); break;
        case 7: _t->reject(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)(int )>(_a, &QDialog::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)()>(_a, &QDialog::accepted, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)()>(_a, &QDialog::rejected, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isSizeGripEnabled(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isModal(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSizeGripEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setModal(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}